

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<TFad<6,_double>,_3> * __thiscall
TPZManVector<TFad<6,_double>,_3>::operator=
          (TPZManVector<TFad<6,_double>,_3> *this,TPZManVector<TFad<6,_double>,_3> *copy)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong *puVar5;
  TFad<6,_double> *pTVar6;
  long lVar7;
  TFad<6,_double> *pTVar8;
  TFad<6,_double> *pTVar9;
  TFad<6,_double> *pTVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar4 = _DAT_014f8350;
  auVar3 = _DAT_014f8340;
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<TFad<6,_double>_>).fNElements;
    if (((this->super_TPZVec<TFad<6,_double>_>).fNAlloc < (long)uVar1) &&
       (pTVar8 = (this->super_TPZVec<TFad<6,_double>_>).fStore,
       pTVar8 != this->fExtAlloc && pTVar8 != (TFad<6,_double> *)0x0)) {
      dVar2 = pTVar8[-1].dx_[5];
      if (dVar2 != 0.0) {
        uVar11 = (long)dVar2 + 0x3ffffffffffffffU & 0x3ffffffffffffff;
        auVar12._8_4_ = (int)uVar11;
        auVar12._0_8_ = uVar11;
        auVar12._12_4_ = (int)(uVar11 >> 0x20);
        pTVar6 = pTVar8 + (long)dVar2 + -1;
        lVar7 = 0;
        auVar12 = auVar12 ^ _DAT_014f8350;
        do {
          auVar14._8_4_ = (int)lVar7;
          auVar14._0_8_ = lVar7;
          auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar14 = (auVar14 | auVar3) ^ auVar4;
          if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                      auVar12._4_4_ < auVar14._4_4_) & 1)) {
            (pTVar6->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
          }
          if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
              auVar14._12_4_ <= auVar12._12_4_) {
            pTVar6[-1].super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
          }
          lVar7 = lVar7 + 2;
          pTVar6 = pTVar6 + -2;
        } while ((uVar11 - ((uint)((long)dVar2 + 0x3ffffffffffffffU) & 1)) + 2 != lVar7);
      }
      operator_delete__(pTVar8[-1].dx_ + 5,(long)dVar2 << 6 | 8);
      (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
    }
    auVar4 = _DAT_014f8350;
    auVar3 = _DAT_014f8340;
    if ((long)uVar1 < 4) {
      pTVar8 = (this->super_TPZVec<TFad<6,_double>_>).fStore;
      if (pTVar8 != (TFad<6,_double> *)0x0 && pTVar8 != this->fExtAlloc) {
        dVar2 = pTVar8[-1].dx_[5];
        if (dVar2 != 0.0) {
          uVar11 = (long)dVar2 + 0x3ffffffffffffffU & 0x3ffffffffffffff;
          auVar13._8_4_ = (int)uVar11;
          auVar13._0_8_ = uVar11;
          auVar13._12_4_ = (int)(uVar11 >> 0x20);
          pTVar6 = pTVar8 + (long)dVar2 + -1;
          lVar7 = 0;
          auVar13 = auVar13 ^ _DAT_014f8350;
          do {
            auVar15._8_4_ = (int)lVar7;
            auVar15._0_8_ = lVar7;
            auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar12 = (auVar15 | auVar3) ^ auVar4;
            if ((bool)(~(auVar12._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar12._0_4_ ||
                        auVar13._4_4_ < auVar12._4_4_) & 1)) {
              (pTVar6->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
            }
            if ((auVar12._12_4_ != auVar13._12_4_ || auVar12._8_4_ <= auVar13._8_4_) &&
                auVar12._12_4_ <= auVar13._12_4_) {
              pTVar6[-1].super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
            }
            lVar7 = lVar7 + 2;
            pTVar6 = pTVar6 + -2;
          } while ((uVar11 - ((uint)((long)dVar2 + 0x3ffffffffffffffU) & 1)) + 2 != lVar7);
        }
        operator_delete__(pTVar8[-1].dx_ + 5,(long)dVar2 << 6 | 8);
      }
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
      (this->super_TPZVec<TFad<6,_double>_>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<TFad<6,_double>_>).fNAlloc < (long)uVar1) {
      puVar5 = (ulong *)operator_new__(-(ulong)(uVar1 >> 0x3a != 0) | uVar1 * 0x40 | 8);
      *puVar5 = uVar1;
      pTVar8 = (TFad<6,_double> *)(puVar5 + 1);
      do {
        (pTVar8->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
        pTVar8->val_ = 0.0;
        pTVar8->dx_[0] = 0.0;
        pTVar8->dx_[1] = 0.0;
        pTVar8->dx_[2] = 0.0;
        pTVar8->dx_[3] = 0.0;
        pTVar8->dx_[4] = 0.0;
        pTVar8->dx_[5] = 0.0;
        pTVar8 = pTVar8 + 1;
      } while (pTVar8 != (TFad<6,_double> *)(puVar5 + uVar1 * 8 + 1));
      (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)(puVar5 + 1);
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = uVar1;
    }
    (this->super_TPZVec<TFad<6,_double>_>).fNElements = uVar1;
    if (0 < (long)uVar1) {
      pTVar8 = (copy->super_TPZVec<TFad<6,_double>_>).fStore;
      pTVar6 = (this->super_TPZVec<TFad<6,_double>_>).fStore;
      uVar11 = 0;
      pTVar9 = pTVar8;
      pTVar10 = pTVar6;
      do {
        if (pTVar6 != pTVar8) {
          lVar7 = 2;
          do {
            pTVar10->dx_[lVar7 + -2] = pTVar9->dx_[lVar7 + -2];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          pTVar6[uVar11].val_ = pTVar8[uVar11].val_;
        }
        uVar11 = uVar11 + 1;
        pTVar10 = pTVar10 + 1;
        pTVar9 = pTVar9 + 1;
      } while (uVar11 != uVar1);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}